

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O3

void __thiscall
reflect::TypeDescriptor_StdVector::dump(TypeDescriptor_StdVector *this,void *obj,int indentLevel)

{
  TypeDescriptor *pTVar1;
  ostream *poVar2;
  void *pvVar3;
  size_t index;
  size_t sVar4;
  char *local_68;
  long local_60;
  char local_58 [16];
  size_t local_48;
  ulong local_40;
  void *local_38;
  
  local_38 = obj;
  local_48 = (*this->getSize)(obj);
  (*(this->super_TypeDescriptor)._vptr_TypeDescriptor[2])(&local_68,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_68,local_60);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_48 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{}",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    sVar4 = 0;
    local_40 = (ulong)(uint)indentLevel;
    do {
      local_68 = local_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,(char)indentLevel * '\x04' + '\x04');
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      pTVar1 = this->itemType;
      pvVar3 = (*this->getItem)(local_38,sVar4);
      (*pTVar1->_vptr_TypeDescriptor[3])(pTVar1,pvVar3,(ulong)(indentLevel + 1));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      sVar4 = sVar4 + 1;
    } while (local_48 != sVar4);
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)((int)local_40 << 2));
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68,local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
  }
  return;
}

Assistant:

virtual void dump(const void* obj, int indentLevel) const override {
        size_t numItems = getSize(obj);
        std::cout << getFullName();
        if (numItems == 0) {
            std::cout << "{}";
        } else {
            std::cout << "{" << std::endl;
            for (size_t index = 0; index < numItems; index++) {
                std::cout << std::string(4 * (indentLevel + 1), ' ') << "[" << index << "] ";
                itemType->dump(getItem(obj, index), indentLevel + 1);
                std::cout << std::endl;
            }
            std::cout << std::string(4 * indentLevel, ' ') << "}";
        }
    }